

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_udp.c
# Opt level: O1

int nni_plat_udp_sockname(nni_plat_udp *udp,nni_sockaddr *sa)

{
  int iVar1;
  int *piVar2;
  undefined1 local_98 [8];
  sockaddr_storage ss;
  socklen_t sz;
  
  ss.__ss_align._4_4_ = 0x80;
  iVar1 = getsockname(udp->udp_fd,(sockaddr *)local_98,(socklen_t *)((long)&ss.__ss_align + 4));
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    iVar1 = nni_plat_errno(*piVar2);
  }
  else {
    iVar1 = nni_posix_sockaddr2nn(sa,local_98,(ulong)ss.__ss_align._4_4_);
  }
  return iVar1;
}

Assistant:

int
nni_plat_udp_sockname(nni_plat_udp *udp, nni_sockaddr *sa)
{
	struct sockaddr_storage ss;
	socklen_t               sz;

	sz = sizeof(ss);
	if (getsockname(udp->udp_fd, (struct sockaddr *) &ss, &sz) < 0) {
		return (nni_plat_errno(errno));
	}
	return (nni_posix_sockaddr2nn(sa, &ss, sz));
}